

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptTextureType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  bool bVar2;
  TLayoutFormat TVar3;
  TType *pTVar4;
  bool bVar5;
  bool bVar6;
  EHlslTokenClass EVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  HlslParseContext *pHVar13;
  _func_int **pp_Var14;
  byte bVar15;
  TSampler sampler;
  TType txType;
  TIntermNode *nodeList;
  uint local_17c;
  TSampler local_178;
  TLayoutFormat local_174;
  TType *local_170;
  TIntermTyped *local_168;
  TType local_160;
  TType local_c8;
  
  local_170 = type;
  EVar7 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  switch(EVar7) {
  case EHTokTexture1d:
    local_17c = 0x100;
    break;
  case EHTokTexture1darray:
    local_17c = 0x100;
    goto LAB_003a2b42;
  case EHTokTexture2d:
    local_17c = 0x200;
    break;
  case EHTokTexture2darray:
    local_17c = 0x200;
    goto LAB_003a2b42;
  case EHTokTexture3d:
    local_17c = 0x300;
    break;
  case EHTokTextureCube:
    local_17c = 0x400;
    break;
  case EHTokTextureCubearray:
    local_17c = 0x400;
LAB_003a2b42:
    uVar10 = 0x10000;
    bVar2 = false;
    bVar15 = 0;
    goto LAB_003a2b81;
  case EHTokTexture2DMS:
    local_17c = 0x200;
    bVar2 = false;
    bVar15 = 1;
    goto LAB_003a2b35;
  case EHTokTexture2DMSarray:
    local_17c = 0x200;
    uVar10 = 0x10000;
    bVar2 = false;
    bVar15 = 1;
    goto LAB_003a2b81;
  case EHTokRWTexture1d:
    local_17c = 0x100;
    goto LAB_003a2b2c;
  case EHTokRWTexture1darray:
    local_17c = 0x100;
    goto LAB_003a2b5a;
  case EHTokRWTexture2d:
    local_17c = 0x200;
    goto LAB_003a2b2c;
  case EHTokRWTexture2darray:
    local_17c = 0x200;
LAB_003a2b5a:
    uVar10 = 0x10000;
    bVar2 = true;
    bVar15 = 0;
    goto LAB_003a2b81;
  case EHTokRWTexture3d:
    local_17c = 0x300;
LAB_003a2b2c:
    bVar15 = 0;
    bVar2 = true;
    goto LAB_003a2b35;
  case EHTokRWBuffer:
    local_17c = 0x600;
    bVar15 = 0;
    bVar2 = true;
    bVar1 = true;
    uVar10 = 0;
    bVar6 = true;
    goto LAB_003a2b84;
  default:
    local_17c = 0x600;
    bVar6 = true;
    bVar2 = false;
    bVar1 = false;
    bVar15 = 0;
    uVar10 = 0;
    if (EVar7 != EHTokBuffer) {
      return false;
    }
    goto LAB_003a2b84;
  }
  bVar2 = false;
  bVar15 = 0;
LAB_003a2b35:
  uVar10 = 0;
LAB_003a2b81:
  bVar1 = true;
  bVar6 = false;
LAB_003a2b84:
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType(&local_160,EbtFloat,EvqUniform,4,0,0,false);
  bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar5) {
    local_c8._vptr_TType = (_func_int **)0x0;
    bVar5 = acceptType(this,&local_160,(TIntermNode **)&local_c8);
    if (bVar5) {
      if ((local_160._8_1_ < 0x10) && ((0x8302U >> (local_160._8_4_ & 0x1f) & 1) != 0)) {
        if (bVar6 && (local_160._8_4_ & 0xf000) != 0) {
          if (((uint)local_160._8_4_ >> 0x10 & 0xf) * ((uint)local_160._8_4_ >> 0xc & 0xf) < 5) {
            pcVar12 = "Unimplemented";
            pcVar11 = "matrix type in buffer";
          }
          else {
            pcVar12 = "Expected";
            pcVar11 = "components < 4 in matrix buffer type";
          }
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,pcVar12,pcVar11,"");
          return false;
        }
        bVar5 = TType::isScalar(&local_160);
        if (((bVar5) || ((local_160._8_4_ & 0x100e00) != 0)) || ((local_160._8_4_ & 0xff) - 0xf < 2)
           ) {
          if ((bVar15 != 0) &&
             (bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma),
             bVar5)) {
            bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
            if (!bVar5) {
              pHVar13 = this->parseContext;
              pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions.
                         _vptr_TParseVersions;
              pcVar12 = "Expected";
              pcVar11 = "multisample count";
              goto LAB_003a2f76;
            }
            bVar5 = acceptLiteral(this,&local_168);
            if (!bVar5) {
              return false;
            }
          }
          bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
          if (bVar5) goto LAB_003a2d4e;
          pHVar13 = this->parseContext;
          pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar12 = "Expected";
          pcVar11 = "right angle bracket";
        }
        else {
          pHVar13 = this->parseContext;
          pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar12 = "Expected";
          pcVar11 = "scalar, vector, or struct type";
        }
      }
      else {
        pHVar13 = this->parseContext;
        pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar12 = "Unimplemented";
        pcVar11 = "basic type in texture";
      }
    }
    else {
      pHVar13 = this->parseContext;
      pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "Expected";
      pcVar11 = "scalar or vector type";
    }
  }
  else if (bVar15 == 0) {
    if (!bVar2) {
LAB_003a2d4e:
      if ((bool)(bVar2 | bVar6)) {
        local_174 = HlslParseContext::getLayoutFromTxType
                              (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                               &local_160);
      }
      else {
        local_174 = ElfNone;
      }
      uVar9 = local_160._8_4_;
      if ((local_160._8_4_ & 0xff) - 0xf < 2) {
        iVar8 = (*local_160._vptr_TType[0x25])();
        if ((char)iVar8 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        uVar9 = (*(((local_160.field_13.structure)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
      }
      if (bVar6 && !bVar2) {
        local_178 = (TSampler)((byte)local_160._8_1_ + uVar10 + 0x1f100600);
      }
      else {
        uVar10 = (uint)bVar15 << 0x12 | uVar10;
        if (bVar2) {
          local_178 = (TSampler)(uVar10 | local_17c | uVar9 & 0xff | 0x1f080000);
        }
        else {
          local_178 = (TSampler)(uVar10 | local_17c | uVar9 & 0xff | 0x1f000000);
        }
      }
      bVar6 = HlslParseContext::setTextureReturnType
                        (this->parseContext,&local_178,&local_160,
                         &(this->super_HlslTokenStream).token.loc);
      pTVar4 = local_170;
      TVar3 = local_174;
      if (!bVar6) {
        return bVar6;
      }
      if (!bVar1) {
        local_178 = (TSampler)((uint)local_178 & 0xffefffff);
      }
      local_c8._vptr_TType = (_func_int **)&PTR__TType_00923160;
      local_c8._8_4_ = 0x10e;
      local_c8.arraySizes = (TArraySizes *)0x0;
      local_c8.field_13.structure = (TTypeList *)0x0;
      local_c8.fieldName = (TString *)0x0;
      local_c8.typeName = (TString *)0x0;
      local_c8.typeParameters = (TTypeParameters *)0x0;
      local_c8.spirvType = (TSpirvType *)0x0;
      local_c8.qualifier.semanticName = (char *)0x0;
      local_c8.qualifier._16_1_ = 0;
      local_c8.qualifier.layoutOffset = -1;
      local_c8.qualifier.layoutAlign = -1;
      local_c8.qualifier.layoutPushConstant = false;
      local_c8.qualifier.layoutBufferReference = false;
      local_c8.qualifier.layoutPassthrough = false;
      local_c8.qualifier.layoutViewportRelative = false;
      local_c8.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
      local_c8.qualifier.layoutBindlessSampler = false;
      local_c8.qualifier.layoutBindlessImage = false;
      local_c8.qualifier.layoutShaderRecord = false;
      local_c8.qualifier.layoutFullQuads = false;
      local_c8.qualifier.layoutQuadDeriv = false;
      local_c8.qualifier.layoutHitObjectShaderRecordNV = false;
      local_c8.qualifier._44_1_ = 0;
      local_c8.qualifier._28_8_ = 0xffffffff001fcfff;
      local_c8.qualifier._36_8_ = 0xffffffffffffffff;
      local_c8.qualifier.spirvStorageClass = -1;
      local_c8.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
      local_c8.qualifier._8_8_ = 5;
      local_c8.sampler = local_178;
      TType::shallowCopy(local_170,&local_c8);
      iVar8 = (*pTVar4->_vptr_TType[10])(pTVar4);
      *(char *)(CONCAT44(extraout_var,iVar8) + 0x2c) = (char)TVar3;
      return bVar6;
    }
    pHVar13 = this->parseContext;
    pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "Expected";
    pcVar11 = "type for RWTexture/RWBuffer";
  }
  else {
    pHVar13 = this->parseContext;
    pp_Var14 = (pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "Expected";
    pcVar11 = "texture type for multisample";
  }
LAB_003a2f76:
  (*pp_Var14[0x2d])(pHVar13,&(this->super_HlslTokenStream).token,pcVar12,pcVar11,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptTextureType(TType& type)
{
    const EHlslTokenClass textureType = peek();

    TSamplerDim dim = EsdNone;
    bool array = false;
    bool ms    = false;
    bool image = false;
    bool combined = true;

    switch (textureType) {
    case EHTokBuffer:            dim = EsdBuffer; combined = false;    break;
    case EHTokTexture1d:         dim = Esd1D;                          break;
    case EHTokTexture1darray:    dim = Esd1D; array = true;            break;
    case EHTokTexture2d:         dim = Esd2D;                          break;
    case EHTokTexture2darray:    dim = Esd2D; array = true;            break;
    case EHTokTexture3d:         dim = Esd3D;                          break;
    case EHTokTextureCube:       dim = EsdCube;                        break;
    case EHTokTextureCubearray:  dim = EsdCube; array = true;          break;
    case EHTokTexture2DMS:       dim = Esd2D; ms = true;               break;
    case EHTokTexture2DMSarray:  dim = Esd2D; array = true; ms = true; break;
    case EHTokRWBuffer:          dim = EsdBuffer; image=true;          break;
    case EHTokRWTexture1d:       dim = Esd1D; array=false; image=true; break;
    case EHTokRWTexture1darray:  dim = Esd1D; array=true;  image=true; break;
    case EHTokRWTexture2d:       dim = Esd2D; array=false; image=true; break;
    case EHTokRWTexture2darray:  dim = Esd2D; array=true;  image=true; break;
    case EHTokRWTexture3d:       dim = Esd3D; array=false; image=true; break;
    default:
        return false;  // not a texture declaration
    }

    advanceToken();  // consume the texture object keyword

    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    TIntermTyped* msCount = nullptr;

    // texture type: required for multisample types and RWBuffer/RWTextures!
    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(txType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = txType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in texture");
            return false;
        }

        // Buffers can handle small mats if they fit in 4 components
        if (dim == EsdBuffer && txType.isMatrix()) {
            if ((txType.getMatrixCols() * txType.getMatrixRows()) > 4) {
                expected("components < 4 in matrix buffer type");
                return false;
            }

            // TODO: except we don't handle it yet...
            unimplemented("matrix type in buffer");
            return false;
        }

        if (!txType.isScalar() && !txType.isVector() && !txType.isStruct()) {
            expected("scalar, vector, or struct type");
            return false;
        }

        if (ms && acceptTokenClass(EHTokComma)) {
            // read sample count for multisample types, if given
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("multisample count");
                return false;
            }

            if (! acceptLiteral(msCount))  // should never fail, since we just found an integer
                return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    } else if (ms) {
        expected("texture type for multisample");
        return false;
    } else if (image) {
        expected("type for RWTexture/RWBuffer");
        return false;
    }

    TArraySizes* arraySizes = nullptr;
    const bool shadow = false; // declared on the sampler

    TSampler sampler;
    TLayoutFormat format = ElfNone;

    // Buffer, RWBuffer and RWTexture (images) require a TLayoutFormat.  We handle only a limit set.
    if (image || dim == EsdBuffer)
        format = parseContext.getLayoutFromTxType(token.loc, txType);

    const TBasicType txBasicType = txType.isStruct() ? (*txType.getStruct())[0].type->getBasicType()
        : txType.getBasicType();

    // Non-image Buffers are combined
    if (dim == EsdBuffer && !image) {
        sampler.set(txType.getBasicType(), dim, array);
    } else {
        // DX10 textures are separated.  TODO: DX9.
        if (image) {
            sampler.setImage(txBasicType, dim, array, shadow, ms);
        } else {
            sampler.setTexture(txBasicType, dim, array, shadow, ms);
        }
    }

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    // Force uncombined, if necessary
    if (!combined)
        sampler.combined = false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = format;

    return true;
}